

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMImage * MT32Emu::ROMImage::makeROMImage(File *file1,File *file2)

{
  ROMInfo **romInfos;
  ROMInfoLists *pRVar1;
  ROMImage *this;
  ROMImage *this_00;
  ROMInfo *pRVar2;
  ROMImage *local_40;
  ROMImage *fullImage;
  ROMImage *image2;
  ROMImage *image1;
  ROMInfo **partialROMInfos;
  File *file2_local;
  File *file1_local;
  
  pRVar1 = getROMInfoLists();
  romInfos = (pRVar1->partialROMInfos).romInfos;
  this = makeROMImage(file1,romInfos);
  this_00 = makeROMImage(file2,romInfos);
  pRVar2 = getROMInfo(this);
  if (pRVar2 != (ROMInfo *)0x0) {
    pRVar2 = getROMInfo(this_00);
    if (pRVar2 != (ROMInfo *)0x0) {
      local_40 = mergeROMImages(this,this_00);
      goto LAB_00118f69;
    }
  }
  local_40 = (ROMImage *)0x0;
LAB_00118f69:
  freeROMImage(this);
  freeROMImage(this_00);
  return local_40;
}

Assistant:

const ROMImage *ROMImage::makeROMImage(File *file1, File *file2) {
	const ROMInfo * const *partialROMInfos = getROMInfoLists().partialROMInfos.romInfos;
	const ROMImage *image1 = makeROMImage(file1, partialROMInfos);
	const ROMImage *image2 = makeROMImage(file2, partialROMInfos);
	const ROMImage *fullImage = image1->getROMInfo() == NULL || image2->getROMInfo() == NULL ? NULL : mergeROMImages(image1, image2);
	freeROMImage(image1);
	freeROMImage(image2);
	return fullImage;
}